

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

char * bson_iter_symbol(bson_iter_t *iter,uint32_t *length)

{
  uint32_t local_24;
  uint8_t *puStack_20;
  uint32_t ret_length;
  char *ret;
  uint32_t *length_local;
  bson_iter_t *iter_local;
  
  puStack_20 = (uint8_t *)0x0;
  local_24 = 0;
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x603,"bson_iter_symbol","iter");
    abort();
  }
  if (iter->raw[iter->type] == '\x0e') {
    puStack_20 = iter->raw + iter->d2;
    local_24 = bson_iter_utf8_len_unsafe(iter);
  }
  if (length != (uint32_t *)0x0) {
    *length = local_24;
  }
  return (char *)puStack_20;
}

Assistant:

const char *
bson_iter_symbol (const bson_iter_t *iter, /* IN */
                  uint32_t *length)        /* OUT */
{
   const char *ret = NULL;
   uint32_t ret_length = 0;

   BSON_ASSERT (iter);

   if (ITER_TYPE (iter) == BSON_TYPE_SYMBOL) {
      ret = (const char *) (iter->raw + iter->d2);
      ret_length = bson_iter_utf8_len_unsafe (iter);
   }

   if (length) {
      *length = ret_length;
   }

   return ret;
}